

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm_info.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_4821::Options::SetAll(Options *this,bool value)

{
  bool value_local;
  Options *this_local;
  
  this->output_video = value;
  this->output_audio = value;
  this->output_size = value;
  this->output_offset = value;
  this->output_ebml_header = value;
  this->output_seconds = value;
  this->output_segment = value;
  this->output_segment_info = value;
  this->output_tracks = value;
  this->output_clusters = value;
  this->output_blocks = value;
  this->output_codec_info = value;
  this->output_clusters_size = value;
  this->output_encrypted_info = value;
  this->output_cues = value;
  this->output_frame_stats = value;
  this->output_vp9_level = value;
  return;
}

Assistant:

void Options::SetAll(bool value) {
  output_video = value;
  output_audio = value;
  output_size = value;
  output_offset = value;
  output_ebml_header = value;
  output_seconds = value;
  output_segment = value;
  output_segment_info = value;
  output_tracks = value;
  output_clusters = value;
  output_blocks = value;
  output_codec_info = value;
  output_clusters_size = value;
  output_encrypted_info = value;
  output_cues = value;
  output_frame_stats = value;
  output_vp9_level = value;
}